

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 DateFormat(jx9_context *pCtx,char *zIn,int nLen,Sytm *pTm)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  time_t in_RAX;
  char *pcVar4;
  char **ppcVar5;
  ulong uVar6;
  long lVar7;
  char *pcVar8;
  jx9_value *pVal;
  byte *pbVar9;
  bool bVar10;
  time_t tt;
  
  iVar3 = (int)in_RAX;
  if (0 < nLen) {
    pbVar9 = (byte *)(zIn + nLen);
    tt = in_RAX;
    do {
      uVar1 = (byte)*zIn - 0x41;
      pcVar8 = zIn;
      if (0x39 < uVar1) {
switchD_00138392_caseD_42:
        pVal = pCtx->pRet;
        iVar3 = 1;
        zIn = pcVar8;
        goto LAB_001387f7;
      }
      iVar3 = (&switchD_00138392::switchdataD_001436c0)[uVar1] + 0x1436c0;
      switch((uint)(byte)*zIn) {
      case 0x41:
        iVar3 = pTm->tm_hour;
        pcVar4 = "PM";
        pcVar8 = "AM";
        goto LAB_001387b2;
      default:
        goto switchD_00138392_caseD_42;
      case 0x44:
        iVar3 = pTm->tm_wday % 7;
        ppcVar5 = zEngDay;
        goto LAB_001386ed;
      case 0x46:
        iVar3 = pTm->tm_mon;
        iVar3 = iVar3 + (((uint)(iVar3 / 6 + (iVar3 >> 0x1f)) >> 1) - (iVar3 >> 0x1f)) * -0xc;
        ppcVar5 = zEngMonth;
        goto LAB_001386b4;
      case 0x47:
        uVar6 = (ulong)(uint)pTm->tm_hour;
        break;
      case 0x48:
        uVar6 = (ulong)(uint)pTm->tm_hour;
        goto LAB_0013880a;
      case 0x49:
        bVar10 = pTm->tm_isdst == 1;
LAB_00138705:
        uVar6 = (ulong)bVar10;
        break;
      case 0x4c:
        uVar1 = pTm->tm_year;
        uVar2 = uVar1 * -0x3d70a3d7 + 0x51eb850;
        if ((uVar2 >> 4 | uVar1 * -0x70000000) < 0xa3d70b) {
          uVar6 = 1;
        }
        else {
          uVar6 = 0;
          if (0x28f5c28 < (uVar2 >> 2 | uVar1 * 0x40000000)) {
            bVar10 = (uVar1 & 3) == 0;
            goto LAB_00138705;
          }
        }
        break;
      case 0x4d:
        iVar3 = pTm->tm_mon;
        iVar3 = iVar3 + (((uint)(iVar3 / 6 + (iVar3 >> 0x1f)) >> 1) - (iVar3 >> 0x1f)) * -0xc;
        ppcVar5 = zEngMonth;
LAB_001386ed:
        pcVar8 = ppcVar5[iVar3];
        pVal = pCtx->pRet;
        iVar3 = 3;
        goto LAB_001387f7;
      case 0x4e:
        uVar6 = (ulong)(uint)aISO8601[pTm->tm_wday % 7];
        break;
      case 0x4f:
      case 0x50:
      case 0x5a:
        iVar3 = jx9_result_string_format(pCtx,"%+05d",pTm->tm_gmtoff);
        goto LAB_00138829;
      case 0x53:
        lVar7 = 0;
        if ((pTm->tm_mday / 10) % 10 != 1) {
          lVar7 = (long)((pTm->tm_mday % 10) * 2);
        }
        pcVar8 = "thstndrdthththththth" + lVar7;
        goto LAB_001387b6;
      case 0x55:
        time(&tt);
        uVar1 = (uint)tt;
        goto LAB_00138797;
      case 0x59:
      case 0x6f:
        uVar6 = (ulong)(uint)pTm->tm_year;
        pcVar8 = "%4d";
        goto LAB_00138822;
      case 0x5c:
        pcVar8 = (char *)((byte *)zIn + 1);
        zIn = pcVar8;
        if (pcVar8 < pbVar9) goto switchD_00138392_caseD_42;
        goto LAB_00138829;
      case 0x61:
        iVar3 = pTm->tm_hour;
        pcVar4 = "pm";
        pcVar8 = "am";
LAB_001387b2:
        if (0xc < iVar3) {
          pcVar8 = pcVar4;
        }
LAB_001387b6:
        pVal = pCtx->pRet;
        iVar3 = 2;
LAB_001387f7:
        iVar3 = jx9_value_string(pVal,pcVar8,iVar3);
        goto LAB_00138829;
      case 99:
        iVar3 = jx9_result_string_format
                          (pCtx,"%4d-%02d-%02dT%02d:%02d:%02d%+05d",(ulong)(uint)pTm->tm_year,
                           (ulong)(pTm->tm_mon + 1),(ulong)(uint)pTm->tm_mday,
                           (ulong)(uint)pTm->tm_hour,(ulong)(uint)pTm->tm_min,
                           (ulong)(uint)pTm->tm_sec,pTm->tm_gmtoff);
        goto LAB_00138829;
      case 100:
        uVar6 = (ulong)(uint)pTm->tm_mday;
        goto LAB_0013880a;
      case 0x65:
        pcVar8 = "GMT";
        if ((byte *)pTm->tm_zone != (byte *)0x0) {
          pcVar8 = pTm->tm_zone;
        }
        goto LAB_001387ee;
      case 0x67:
        iVar3 = pTm->tm_hour;
        uVar1 = iVar3 + (((uint)(iVar3 / 6 + (iVar3 >> 0x1f)) >> 1) - (iVar3 >> 0x1f)) * -0xc + 1;
        pcVar8 = "%d";
        goto LAB_001385c0;
      case 0x68:
        iVar3 = pTm->tm_hour;
        uVar1 = iVar3 + (((uint)(iVar3 / 6 + (iVar3 >> 0x1f)) >> 1) - (iVar3 >> 0x1f)) * -0xc + 1;
        goto LAB_001385b9;
      case 0x69:
        uVar6 = (ulong)(uint)pTm->tm_min;
        goto LAB_0013880a;
      case 0x6a:
        uVar6 = (ulong)(uint)pTm->tm_mday;
        break;
      case 0x6c:
        iVar3 = pTm->tm_wday % 7;
        ppcVar5 = zEngDay;
LAB_001386b4:
        pcVar8 = ppcVar5[iVar3];
LAB_001387ee:
        pVal = pCtx->pRet;
        iVar3 = -1;
        goto LAB_001387f7;
      case 0x6d:
        uVar6 = (ulong)(pTm->tm_mon + 1);
        goto LAB_0013880a;
      case 0x6e:
        uVar6 = (ulong)(pTm->tm_mon + 1);
        break;
      case 0x72:
        iVar3 = pTm->tm_mon;
        iVar3 = jx9_result_string_format
                          (pCtx,"%.3s, %02d %.3s %4d %02d:%02d:%02d",zEngDay[pTm->tm_wday % 7],
                           (ulong)(uint)pTm->tm_mday,
                           zEngMonth[(int)(iVar3 + (((uint)(iVar3 / 6 + (iVar3 >> 0x1f)) >> 1) -
                                                   (iVar3 >> 0x1f)) * -0xc)],
                           (ulong)(uint)pTm->tm_year,(ulong)(uint)pTm->tm_hour,
                           (ulong)(uint)pTm->tm_min,(ulong)(uint)pTm->tm_sec);
        goto LAB_00138829;
      case 0x73:
        uVar6 = (ulong)(uint)pTm->tm_sec;
LAB_0013880a:
        pcVar8 = "%02d";
        goto LAB_00138822;
      case 0x74:
        iVar3 = pTm->tm_mon;
        uVar6 = (ulong)(uint)DateFormat::aMonDays
                             [(int)(iVar3 + (((uint)(iVar3 / 6 + (iVar3 >> 0x1f)) >> 1) -
                                            (iVar3 >> 0x1f)) * -0xc)];
        if (iVar3 == 1) {
          uVar1 = pTm->tm_year;
          uVar2 = uVar1 * -0x3d70a3d7 + 0x51eb850;
          if (0xa3d70a < (uVar2 >> 4 | uVar1 * -0x70000000)) {
            if ((uVar1 & 3) != 0) {
              uVar6 = 0x1c;
            }
            if ((uVar2 >> 2 | uVar1 * 0x40000000) < 0x28f5c29) {
              uVar6 = 0x1c;
            }
          }
        }
        break;
      case 0x75:
        uVar1 = pTm->tm_sec * 1000000;
LAB_00138797:
        uVar6 = (ulong)uVar1;
        pcVar8 = "%u";
        goto LAB_00138822;
      case 0x77:
        uVar6 = (ulong)(uint)pTm->tm_wday;
        break;
      case 0x79:
        uVar1 = pTm->tm_year % 100;
LAB_001385b9:
        pcVar8 = "%02d";
LAB_001385c0:
        uVar6 = (ulong)uVar1;
        goto LAB_00138822;
      case 0x7a:
        uVar6 = (ulong)(uint)pTm->tm_yday;
      }
      pcVar8 = "%d";
LAB_00138822:
      iVar3 = jx9_result_string_format(pCtx,pcVar8,uVar6);
LAB_00138829:
      zIn = (char *)((byte *)zIn + 1);
    } while (zIn < pbVar9);
  }
  return iVar3;
}

Assistant:

static sxi32 DateFormat(jx9_context *pCtx, const char *zIn, int nLen, Sytm *pTm)
{
	const char *zEnd = &zIn[nLen];
	const char *zCur;
	/* Start the format process */
	for(;;){
		if( zIn >= zEnd ){
			/* No more input to process */
			break;
		}
		switch(zIn[0]){
		case 'd':
			/* Day of the month, 2 digits with leading zeros */
			jx9_result_string_format(pCtx, "%02d", pTm->tm_mday);
			break;
		case 'D':
			/*A textual representation of a day, three letters*/
			zCur = SyTimeGetDay(pTm->tm_wday);
			jx9_result_string(pCtx, zCur, 3);
			break;
		case 'j':
			/*	Day of the month without leading zeros */
			jx9_result_string_format(pCtx, "%d", pTm->tm_mday);
			break;
		case 'l':
			/* A full textual representation of the day of the week */
			zCur = SyTimeGetDay(pTm->tm_wday);
			jx9_result_string(pCtx, zCur, -1/*Compute length automatically*/);
			break;
		case 'N':{
			/* ISO-8601 numeric representation of the day of the week */
			jx9_result_string_format(pCtx, "%d", aISO8601[pTm->tm_wday % 7 ]);
			break;
				 }
		case 'w':
			/*Numeric representation of the day of the week*/
			jx9_result_string_format(pCtx, "%d", pTm->tm_wday);
			break;
		case 'z':
			/*The day of the year*/
			jx9_result_string_format(pCtx, "%d", pTm->tm_yday);
			break;
		case 'F':
			/*A full textual representation of a month, such as January or March*/
			zCur = SyTimeGetMonth(pTm->tm_mon);
			jx9_result_string(pCtx, zCur, -1/*Compute length automatically*/);
			break;
		case 'm':
			/*Numeric representation of a month, with leading zeros*/
			jx9_result_string_format(pCtx, "%02d", pTm->tm_mon + 1);
			break;
		case 'M':
			/*A short textual representation of a month, three letters*/
			zCur = SyTimeGetMonth(pTm->tm_mon);
			jx9_result_string(pCtx, zCur, 3);
			break;
		case 'n':
			/*Numeric representation of a month, without leading zeros*/
			jx9_result_string_format(pCtx, "%d", pTm->tm_mon + 1);
			break;
		case 't':{
			static const int aMonDays[] = {31, 29, 31, 30, 31, 30, 31, 31, 30, 31, 30, 31 };
			int nDays = aMonDays[pTm->tm_mon % 12 ];
			if( pTm->tm_mon == 1 /* 'February' */ && !IS_LEAP_YEAR(pTm->tm_year) ){
				nDays = 28;
			}
			/*Number of days in the given month*/
			jx9_result_string_format(pCtx, "%d", nDays);
			break;
				 }
		case 'L':{
			int isLeap = IS_LEAP_YEAR(pTm->tm_year);
			/* Whether it's a leap year */
			jx9_result_string_format(pCtx, "%d", isLeap);
			break;
				 }
		case 'o':
			/* ISO-8601 year number.*/
			jx9_result_string_format(pCtx, "%4d", pTm->tm_year);
			break;
		case 'Y':
			/*	A full numeric representation of a year, 4 digits */
			jx9_result_string_format(pCtx, "%4d", pTm->tm_year);
			break;
		case 'y':
			/*A two digit representation of a year*/
			jx9_result_string_format(pCtx, "%02d", pTm->tm_year%100);
			break;
		case 'a':
			/*	Lowercase Ante meridiem and Post meridiem */
			jx9_result_string(pCtx, pTm->tm_hour > 12 ? "pm" : "am", 2);
			break;
		case 'A':
			/*	Uppercase Ante meridiem and Post meridiem */
			jx9_result_string(pCtx, pTm->tm_hour > 12 ? "PM" : "AM", 2);
			break;
		case 'g':
			/*	12-hour format of an hour without leading zeros*/
			jx9_result_string_format(pCtx, "%d", 1+(pTm->tm_hour%12));
			break;
		case 'G':
			/* 24-hour format of an hour without leading zeros */
			jx9_result_string_format(pCtx, "%d", pTm->tm_hour);
			break;
		case 'h':
			/* 12-hour format of an hour with leading zeros */
			jx9_result_string_format(pCtx, "%02d", 1+(pTm->tm_hour%12));
			break;
		case 'H':
			/*	24-hour format of an hour with leading zeros */
			jx9_result_string_format(pCtx, "%02d", pTm->tm_hour);
			break;
		case 'i':
			/* 	Minutes with leading zeros */
			jx9_result_string_format(pCtx, "%02d", pTm->tm_min);
			break;
		case 's':
			/* 	second with leading zeros */
			jx9_result_string_format(pCtx, "%02d", pTm->tm_sec);
			break;
		case 'u':
			/* 	Microseconds */
			jx9_result_string_format(pCtx, "%u", pTm->tm_sec * SX_USEC_PER_SEC);
			break;
		case 'S':{
			/* English ordinal suffix for the day of the month, 2 characters */
			static const char zSuffix[] = "thstndrdthththththth";
			int v = pTm->tm_mday;
			jx9_result_string(pCtx, &zSuffix[2 * (int)(v / 10 % 10 != 1 ? v % 10 : 0)], (int)sizeof(char) * 2);
			break;
				 }
		case 'e':
			/* 	Timezone identifier */
			zCur = pTm->tm_zone;
			if( zCur == 0 ){
				/* Assume GMT */
				zCur = "GMT";
			}
			jx9_result_string(pCtx, zCur, -1);
			break;
		case 'I':
			/* Whether or not the date is in daylight saving time */
#ifdef __WINNT__
#ifdef _MSC_VER
#ifndef _WIN32_WCE
			_get_daylight(&pTm->tm_isdst);
#endif
#endif
#endif
			jx9_result_string_format(pCtx, "%d", pTm->tm_isdst == 1);
			break;
		case 'r':
			/* RFC 2822 formatted date 	Example: Thu, 21 Dec 2000 16:01:07 */
			jx9_result_string_format(pCtx, "%.3s, %02d %.3s %4d %02d:%02d:%02d", 
				SyTimeGetDay(pTm->tm_wday), 
				pTm->tm_mday, 
				SyTimeGetMonth(pTm->tm_mon), 
				pTm->tm_year, 
				pTm->tm_hour, 
				pTm->tm_min, 
				pTm->tm_sec
				);
			break;
		case 'U':{
			time_t tt;
			/* Seconds since the Unix Epoch */
			time(&tt);
			jx9_result_string_format(pCtx, "%u", (unsigned int)tt);
			break;
				 }
		case 'O':
		case 'P':
			/* Difference to Greenwich time (GMT) in hours */
			jx9_result_string_format(pCtx, "%+05d", pTm->tm_gmtoff);
			break;
		case 'Z':
			/* Timezone offset in seconds. The offset for timezones west of UTC
			 * is always negative, and for those east of UTC is always positive.
			 */
			jx9_result_string_format(pCtx, "%+05d", pTm->tm_gmtoff);
			break;
		case 'c':
			/* 	ISO 8601 date */
			jx9_result_string_format(pCtx, "%4d-%02d-%02dT%02d:%02d:%02d%+05d", 
				pTm->tm_year, 
				pTm->tm_mon+1, 
				pTm->tm_mday, 
				pTm->tm_hour, 
				pTm->tm_min, 
				pTm->tm_sec, 
				pTm->tm_gmtoff
				);
			break;
		case '\\':
			zIn++;
			/* Expand verbatim */
			if( zIn < zEnd ){
				jx9_result_string(pCtx, zIn, (int)sizeof(char));
			}
			break;
		default:
			/* Unknown format specifer, expand verbatim */
			jx9_result_string(pCtx, zIn, (int)sizeof(char));
			break;
		}
		/* Point to the next character */
		zIn++;
	}
	return SXRET_OK;
}